

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int precallC(lua_State *L,StkId func,int nresults,lua_CFunction f)

{
  long lVar1;
  int nres;
  StkId in_RAX;
  CallInfo *ci;
  
  if ((long)(L->stack_last).p - (L->top).offset < 0x150) {
    precallC();
    func = in_RAX;
  }
  lVar1 = (L->top).offset;
  ci = L->ci->next;
  if (ci == (CallInfo *)0x0) {
    ci = luaE_extendCI(L);
  }
  L->ci = ci;
  (ci->func).p = func;
  ci->nresults = (short)nresults;
  ci->callstatus = 2;
  (ci->top).p = (StkId)(lVar1 + 0x140);
  L->ci = ci;
  if ((L->hookmask & 1U) != 0) {
    precallC();
  }
  nres = (*f)(L);
  luaD_poscall(L,ci,nres);
  return nres;
}

Assistant:

l_sinline int precallC (lua_State *L, StkId func, int nresults,
                                            lua_CFunction f) {
  int n;  /* number of returns */
  CallInfo *ci;
  checkstackGCp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
  L->ci = ci = prepCallInfo(L, func, nresults, CIST_C,
                               L->top.p + LUA_MINSTACK);
  lua_assert(ci->top.p <= L->stack_last.p);
  if (l_unlikely(L->hookmask & LUA_MASKCALL)) {
    int narg = cast_int(L->top.p - func) - 1;
    luaD_hook(L, LUA_HOOKCALL, -1, 1, narg);
  }
  lua_unlock(L);
  n = (*f)(L);  /* do the actual call */
  lua_lock(L);
  api_checknelems(L, n);
  luaD_poscall(L, ci, n);
  return n;
}